

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

lys_node * lyd_new_find_schema(lyd_node *parent,lys_module *module,int rpc_output)

{
  lys_node *plVar1;
  lys_node **pplVar2;
  
  if (parent == (lyd_node *)0x0) {
    pplVar2 = &module->data;
LAB_00167649:
    plVar1 = *pplVar2;
  }
  else {
    if (parent->schema != (lys_node *)0x0) {
      plVar1 = parent->schema->child;
      if (plVar1 == (lys_node *)0x0) {
        plVar1 = (lys_node *)0x0;
      }
      else if (plVar1->nodetype == (uint)(rpc_output == 0) * 0x200 + LYS_INPUT) {
        plVar1 = plVar1->next;
      }
      if (plVar1 != (lys_node *)0x0) {
        if (plVar1->nodetype != (uint)(rpc_output != 0) * 0x200 + LYS_INPUT) {
          return plVar1;
        }
        pplVar2 = &plVar1->child;
        goto LAB_00167649;
      }
    }
    plVar1 = (lys_node *)0x0;
  }
  return plVar1;
}

Assistant:

static struct lys_node *
lyd_new_find_schema(struct lyd_node *parent, const struct lys_module *module, int rpc_output)
{
    struct lys_node *siblings;

    if (!parent) {
        siblings = module->data;
    } else {
        if (!parent->schema) {
            return NULL;
        }
        siblings = parent->schema->child;
        if (siblings && (siblings->nodetype == (rpc_output ? LYS_INPUT : LYS_OUTPUT))) {
            siblings = siblings->next;
        }
        if (siblings && (siblings->nodetype == (rpc_output ? LYS_OUTPUT : LYS_INPUT))) {
            siblings = siblings->child;
        }
    }

    return siblings;
}